

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O1

void __thiscall lzham::task_pool::task_pool(task_pool *this,uint num_threads)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = pthread_spin_init((pthread_spinlock_t *)this,0);
  if (iVar2 != 0) {
    lzham_fail("\"spinlock: pthread_spin_init() failed\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
               ,0x65);
  }
  lVar3 = 8;
  do {
    puVar1 = (undefined8 *)((long)&(this->m_task_stack).m_stack[0].m_data + lVar3 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m_task_stack).m_stack + lVar3 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x208);
  (this->m_task_stack).m_top = 0;
  this->m_num_threads = 0;
  iVar2 = sem_init((sem_t *)&this->m_tasks_available,0,0);
  if (iVar2 != 0) {
    lzham_fail("\"semaphore: sem_init() failed\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
               ,0x1c);
  }
  this->m_num_outstanding_tasks = 0;
  this->m_exit_flag = 0;
  this->m_threads[0] = 0;
  this->m_threads[1] = 0;
  this->m_threads[2] = 0;
  this->m_threads[3] = 0;
  this->m_threads[4] = 0;
  this->m_threads[5] = 0;
  this->m_threads[6] = 0;
  this->m_threads[7] = 0;
  this->m_threads[8] = 0;
  this->m_threads[9] = 0;
  this->m_threads[10] = 0;
  this->m_threads[0xb] = 0;
  this->m_threads[0xc] = 0;
  this->m_threads[0xd] = 0;
  this->m_threads[0xe] = 0;
  this->m_threads[0xf] = 0;
  iVar2 = init(this,(EVP_PKEY_CTX *)(ulong)num_threads);
  if ((char)iVar2 == '\0') {
    lzham_assert("status",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.cpp"
                 ,0x38);
  }
  return;
}

Assistant:

task_pool::task_pool(uint num_threads) :
      m_num_threads(0),
      m_tasks_available(0, 32767),
      m_num_outstanding_tasks(0),
      m_exit_flag(false)
   {
      utils::zero_object(m_threads);

      bool status = init(num_threads);
      LZHAM_VERIFY(status);
   }